

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O1

double traverse_itree<PredictionData<double,unsigned_long>,unsigned_long,ImputedData<unsigned_long,long_double>>
                 (vector<IsoTree,_std::allocator<IsoTree>_> *tree,IsoForest *model_outputs,
                 PredictionData<double,_unsigned_long> *prediction_data,
                 vector<ImputeNode,_std::allocator<ImputeNode>_> *impute_nodes,
                 ImputedData<unsigned_long,_long_double> *imputed_data,double curr_weight,size_t row
                 ,unsigned_long *tree_num,double *tree_depth,size_t curr_lev)

{
  NewCategAction NVar1;
  MissingAction MVar2;
  pointer pIVar3;
  pointer pcVar4;
  pointer pcVar5;
  size_t *psVar6;
  size_t sVar7;
  uint uVar8;
  size_t sVar9;
  ulong uVar10;
  size_t *psVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  pointer pIVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  
  uVar8 = 2;
  if ((prediction_data->Xr_indptr == (unsigned_long *)0x0) &&
     (uVar8 = 3, prediction_data->Xc_indptr == (unsigned_long *)0x0)) {
    uVar8 = (uint)prediction_data->is_col_major;
  }
  pIVar3 = (tree->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pIVar15 = pIVar3 + curr_lev;
  if (pIVar3[curr_lev].tree_left != 0) {
    psVar11 = &pIVar3[curr_lev].tree_left;
    do {
      if (pIVar15->col_type == Categorical) {
        sVar9 = pIVar15->col_num;
        psVar6 = &prediction_data->ncols_categ;
        sVar7 = row;
        if (prediction_data->is_col_major != false) {
          sVar9 = row;
          psVar6 = &prediction_data->nrows;
          sVar7 = pIVar15->col_num;
        }
        uVar12 = prediction_data->categ_data[sVar7 * *psVar6 + sVar9];
        uVar10 = (ulong)(int)uVar12;
        if ((long)uVar10 < 0) {
          MVar2 = model_outputs->missing_action;
          if (MVar2 != Impute) {
            if (MVar2 == Fail) {
              return NAN;
            }
            if (MVar2 == Divide) goto LAB_0014e665;
            goto LAB_0014e5e2;
          }
          if (pIVar15->pct_tree_left < 0.5) goto LAB_0014e5d8;
        }
        else if (model_outputs->cat_split_type == SubSet) {
          pcVar4 = (pIVar15->cat_split).
                   super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pcVar5 = *(pointer *)
                    ((long)&(pIVar15->cat_split).
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl +
                    8);
          if (pcVar4 == pcVar5) {
            if ((int)uVar12 < 2) {
              if (uVar12 != 0) {
LAB_0014e5d8:
                psVar11 = &pIVar15->tree_right;
              }
            }
            else {
              if (model_outputs->new_cat_action != Smallest) {
                if (model_outputs->new_cat_action == Weighted) goto LAB_0014e665;
                goto LAB_0014e5e2;
              }
LAB_0014e5c8:
              if (0.5 < pIVar15->pct_tree_left || pIVar15->pct_tree_left == 0.5) goto LAB_0014e5d8;
            }
          }
          else {
            NVar1 = model_outputs->new_cat_action;
            iVar13 = (int)pcVar4;
            iVar14 = (int)pcVar5;
            if (NVar1 == Weighted) {
              if (iVar14 - iVar13 <= (int)uVar12) {
LAB_0014e665:
                if (tree_num == (unsigned_long *)0x0 && tree_depth == (double *)0x0) {
                  pIVar15 = (tree->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                            super__Vector_impl_data._M_start;
                  dVar16 = pIVar15[curr_lev].pct_tree_left;
                  dVar17 = traverse_itree<PredictionData<double,unsigned_long>,unsigned_long,ImputedData<unsigned_long,long_double>>
                                     (tree,model_outputs,prediction_data,impute_nodes,imputed_data,
                                      dVar16 * curr_weight,row,(unsigned_long *)0x0,tree_depth,
                                      pIVar15[curr_lev].tree_left);
                  pIVar15 = (tree->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                            super__Vector_impl_data._M_start;
                  dVar19 = 1.0 - pIVar15[curr_lev].pct_tree_left;
                  dVar18 = traverse_itree<PredictionData<double,unsigned_long>,unsigned_long,ImputedData<unsigned_long,long_double>>
                                     (tree,model_outputs,prediction_data,impute_nodes,imputed_data,
                                      curr_weight * dVar19,row,(unsigned_long *)0x0,tree_depth,
                                      pIVar15[curr_lev].tree_right);
                  return (dVar17 * dVar16 + dVar18 * dVar19) - 0.0;
                }
                throw_unsupported_pred_error();
              }
              if (pcVar4[uVar10] == '\0') goto LAB_0014e5d8;
              if (pcVar4[uVar10] == -1) goto LAB_0014e665;
            }
            else {
              if (NVar1 == Smallest) {
                if (iVar14 - iVar13 <= (int)uVar12) goto LAB_0014e5c8;
              }
              else {
                if (NVar1 != Random) goto LAB_0014e5e2;
                if (iVar14 - iVar13 <= (int)uVar12) {
                  uVar12 = (int)uVar12 % (iVar14 - iVar13);
                }
                uVar10 = (ulong)uVar12;
              }
              if (pcVar4[uVar10] == '\0') goto LAB_0014e5d8;
            }
          }
        }
        else {
          if (model_outputs->cat_split_type != SingleCateg) goto LAB_0014e5e2;
          if (uVar12 != pIVar15->chosen_cat) goto LAB_0014e5d8;
        }
        curr_lev = *psVar11;
      }
      else if (pIVar15->col_type == Numeric) {
        dVar16 = (double)(*(code *)(&DAT_0036b57c + *(int *)(&DAT_0036b57c + (ulong)uVar8 * 4)))();
        return dVar16;
      }
LAB_0014e5e2:
      pIVar3 = (tree->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pIVar15 = pIVar3 + curr_lev;
      psVar11 = &pIVar3[curr_lev].tree_left;
    } while (*psVar11 != 0);
  }
  if (tree_num != (unsigned_long *)0x0) {
    tree_num[row] = curr_lev;
  }
  if (tree_depth != (double *)0x0) {
    *tree_depth = pIVar15->score;
  }
  if (imputed_data != (ImputedData<unsigned_long,_long_double> *)0x0) {
    add_from_impute_node<ImputedData<unsigned_long,long_double>>
              ((impute_nodes->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
               super__Vector_impl_data._M_start + curr_lev,imputed_data,curr_weight);
  }
  return (tree->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
         super__Vector_impl_data._M_start[curr_lev].score - 0.0;
}

Assistant:

double traverse_itree(std::vector<IsoTree>     &tree,
                      IsoForest                &model_outputs,
                      PredictionData           &prediction_data,
                      std::vector<ImputeNode> *impute_nodes,     /* only when imputing missing */
                      ImputedData             *imputed_data,     /* only when imputing missing */
                      double                   curr_weight,      /* only when imputing missing */
                      size_t                   row,
                      sparse_ix *restrict      tree_num,
                      double *restrict         tree_depth,
                      size_t                   curr_lev)
{
    double xval;
    int    cval;
    double range_penalty = 0;

    NumericConfig numeric_config;
    if (prediction_data.Xr_indptr != NULL)
        numeric_config = SparseCSR;
    else if (prediction_data.Xc_indptr != NULL)
        numeric_config = SparseCSC;
    else if (prediction_data.is_col_major)
        numeric_config = DenseColMajor;
    else
        numeric_config = DenseRowMajor;

    sparse_ix *row_st = NULL, *row_end = NULL;
    if (numeric_config == SparseCSR)
    {
        row_st  = prediction_data.Xr_ind + prediction_data.Xr_indptr[row];
        row_end = prediction_data.Xr_ind + prediction_data.Xr_indptr[row + 1];
    }

    while (true)
    {
        // if (tree[curr_lev].score >= 0.)
        if (unlikely(tree[curr_lev].tree_left == 0))
        {
            if (unlikely(tree_num != NULL))
                tree_num[row] = curr_lev;
            if (unlikely(tree_depth != NULL))
                *tree_depth = tree[curr_lev].score;
            if (unlikely(imputed_data != NULL))
                add_from_impute_node((*impute_nodes)[curr_lev], *imputed_data, curr_weight);

            return tree[curr_lev].score - range_penalty;
        }

        else
        {
            switch(tree[curr_lev].col_type)
            {
                case Numeric:
                {
                    switch(numeric_config)
                    {
                        case DenseRowMajor:
                        {
                            xval = prediction_data.numeric_data[tree[curr_lev].col_num + row * prediction_data.ncols_numeric];
                            break;
                        }

                        case DenseColMajor:
                        {
                            xval = prediction_data.numeric_data[row +  tree[curr_lev].col_num * prediction_data.nrows];
                            break;
                        }

                        case SparseCSR:
                        {
                            xval = extract_spR(prediction_data, row_st, row_end, tree[curr_lev].col_num);
                            break;
                        }

                        case SparseCSC:
                        {
                            xval = extract_spC(prediction_data, row, tree[curr_lev].col_num);
                            break;
                        }
                    }

                    if (unlikely(std::isnan(xval)))
                    {
                        switch(model_outputs.missing_action)
                        {
                            case Divide:
                            {
                                if (tree_num || tree_depth) throw_unsupported_pred_error();
                                return
                                    tree[curr_lev].pct_tree_left
                                        * traverse_itree(tree, model_outputs, prediction_data,
                                                         impute_nodes, imputed_data, curr_weight * tree[curr_lev].pct_tree_left,
                                                         row, (sparse_ix*)NULL, tree_depth, tree[curr_lev].tree_left)
                                    + (1. - tree[curr_lev].pct_tree_left)
                                        * traverse_itree(tree, model_outputs, prediction_data,
                                                         impute_nodes, imputed_data, curr_weight * (1 - tree[curr_lev].pct_tree_left),
                                                         row, (sparse_ix*)NULL, tree_depth, tree[curr_lev].tree_right)
                                    - range_penalty;
                            }

                            case Impute:
                            {
                                curr_lev = (tree[curr_lev].pct_tree_left >= .5)?
                                                tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                break;
                            }

                            case Fail:
                            {
                                return NAN;
                            }
                        }
                    }

                    else
                    {
                        range_penalty += (xval < tree[curr_lev].range_low) || (xval > tree[curr_lev].range_high);
                        curr_lev = (xval <= tree[curr_lev].num_split)?
                                    tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                    }
                    break;
                }

                case Categorical:
                {
                    cval =  prediction_data.categ_data[
                                prediction_data.is_col_major?
                                (row +  tree[curr_lev].col_num * prediction_data.nrows)
                                    :
                                (tree[curr_lev].col_num + row * prediction_data.ncols_categ)
                            ];
                    if (unlikely(cval < 0))
                    {
                        switch(model_outputs.missing_action)
                        {
                            case Divide:
                            {
                                if (tree_num || tree_depth) throw_unsupported_pred_error();
                                return
                                    tree[curr_lev].pct_tree_left
                                        * traverse_itree(tree, model_outputs, prediction_data,
                                                         impute_nodes, imputed_data, curr_weight * tree[curr_lev].pct_tree_left,
                                                         row, (sparse_ix*)NULL, tree_depth, tree[curr_lev].tree_left)
                                    + (1. - tree[curr_lev].pct_tree_left)
                                        * traverse_itree(tree, model_outputs, prediction_data,
                                                         impute_nodes, imputed_data, curr_weight * (1 - tree[curr_lev].pct_tree_left),
                                                         row, (sparse_ix*)NULL, tree_depth, tree[curr_lev].tree_right)
                                    - range_penalty;
                            }

                            case Impute:
                            {
                                curr_lev = (tree[curr_lev].pct_tree_left >= .5)?
                                                tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                break;
                            }

                            case Fail:
                            {
                                return NAN;
                            }
                        }
                    }

                    else
                    {
                        switch(model_outputs.cat_split_type)
                        {
                            case SingleCateg:
                            {
                                curr_lev = (cval == tree[curr_lev].chosen_cat)?
                                            tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                break;
                            }

                            case SubSet:
                            {

                                if (tree[curr_lev].cat_split.empty())
                                {
                                    if (cval <= 1)
                                    {
                                        curr_lev = (cval == 0)?
                                                    tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                    }

                                    else
                                    {
                                        switch(model_outputs.new_cat_action)
                                        {
                                            case Smallest:
                                            {
                                                curr_lev =  (tree[curr_lev].pct_tree_left < .5)? tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                                break;
                                            }

                                            case Weighted:
                                            {
                                                if (tree_num || tree_depth) throw_unsupported_pred_error();
                                                return
                                                    tree[curr_lev].pct_tree_left
                                                        * traverse_itree(tree, model_outputs, prediction_data,
                                                                         impute_nodes, imputed_data, curr_weight * tree[curr_lev].pct_tree_left,
                                                                         row, (sparse_ix*)NULL, tree_depth, tree[curr_lev].tree_left)
                                                    + (1. - tree[curr_lev].pct_tree_left)
                                                        * traverse_itree(tree, model_outputs, prediction_data,
                                                                         impute_nodes, imputed_data, curr_weight * (1 - tree[curr_lev].pct_tree_left),
                                                                         row, (sparse_ix*)NULL, tree_depth, tree[curr_lev].tree_right)
                                                    - range_penalty;
                                            }

                                            default:
                                            {
                                                assert(0);
                                                break;
                                            }
                                        }
                                    }
                                }

                                else
                                {
                                    switch(model_outputs.new_cat_action)
                                    {
                                        case Random:
                                        {
                                            cval = (cval >= (int)tree[curr_lev].cat_split.size())?
                                                    (cval % (int)tree[curr_lev].cat_split.size()) : cval;
                                            curr_lev = (tree[curr_lev].cat_split[cval])?
                                                        tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                            break;
                                        }

                                        case Smallest:
                                        {
                                            if (unlikely(cval >= (int)tree[curr_lev].cat_split.size()))
                                            {
                                                curr_lev =  (tree[curr_lev].pct_tree_left < .5)? tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                            }

                                            else
                                            {
                                                curr_lev = (tree[curr_lev].cat_split[cval])?
                                                            tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                            }
                                            break;
                                        }

                                        case Weighted:
                                        {
                                            if (cval >= (int)tree[curr_lev].cat_split.size()
                                                    ||
                                                tree[curr_lev].cat_split[cval] == (-1))
                                            {
                                                if (tree_num || tree_depth) throw_unsupported_pred_error();
                                                return
                                                    tree[curr_lev].pct_tree_left
                                                        * traverse_itree(tree, model_outputs, prediction_data,
                                                                         impute_nodes, imputed_data, curr_weight * tree[curr_lev].pct_tree_left,
                                                                         row, (sparse_ix*)NULL, tree_depth, tree[curr_lev].tree_left)
                                                    + (1. - tree[curr_lev].pct_tree_left)
                                                        * traverse_itree(tree, model_outputs, prediction_data,
                                                                         impute_nodes, imputed_data, curr_weight * (1 - tree[curr_lev].pct_tree_left),
                                                                         row, (sparse_ix*)NULL, tree_depth, tree[curr_lev].tree_right)
                                                    - range_penalty;
                                            }

                                            else
                                            {
                                                curr_lev = (tree[curr_lev].cat_split[cval])?
                                                            tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                            }
                                            break;
                                        }
                                    }
                                }
                                break;
                            }
                        }
                    }
                    break;
                }

                default:
                {
                    assert(0);
                    break;
                }
            }
        }
    }
}